

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  long lVar1;
  long *arg1;
  Status SVar2;
  Iterator *this;
  void *arg2;
  Block *this_00;
  long in_FS_OFFSET;
  Status local_a8;
  Slice key;
  Status s;
  Slice input;
  BlockHandle handle;
  BlockContents contents;
  char cache_key_buffer [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arg1 = *(long **)(*arg + 0x30);
  handle.offset_._0_4_ = 0xffffffff;
  handle.offset_._4_4_ = 0xffffffff;
  handle.size_._0_4_ = 0xffffffff;
  handle.size_._4_4_ = 0xffffffff;
  BlockHandle::DecodeFrom((BlockHandle *)&s,(Slice *)&handle);
  if (s.state_ == (char *)0x0) {
    contents.data.data_ = "";
    contents.data.size_ = 0;
    if (arg1 == (long *)0x0) {
      ReadBlock((leveldb *)cache_key_buffer,*(RandomAccessFile **)(*arg + 0x68),options,&handle,
                &contents);
      SVar2 = s;
      s.state_ = (char *)cache_key_buffer._0_8_;
      cache_key_buffer._0_8_ = SVar2.state_;
      Status::~Status((Status *)cache_key_buffer);
      if (s.state_ == (char *)0x0) {
        this_00 = (Block *)operator_new(0x18);
        Block::Block(this_00,&contents);
LAB_00543bb7:
        arg2 = (void *)0x0;
        goto LAB_00543bba;
      }
    }
    else {
      EncodeFixed64(cache_key_buffer,*(uint64_t *)(*arg + 0x70));
      EncodeFixed64(cache_key_buffer + 8,CONCAT44(handle.offset_._4_4_,(undefined4)handle.offset_));
      key.size_ = 0x10;
      key.data_ = cache_key_buffer;
      arg2 = (void *)(**(code **)(*arg1 + 0x18))(arg1);
      if (arg2 == (void *)0x0) {
        ReadBlock((leveldb *)&local_a8,*(RandomAccessFile **)(*arg + 0x68),options,&handle,&contents
                 );
        SVar2 = s;
        s.state_ = local_a8.state_;
        local_a8.state_ = SVar2.state_;
        Status::~Status(&local_a8);
        if (s.state_ == (char *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,&contents);
          if ((contents.cachable != true) || (options->fill_cache != true)) goto LAB_00543bb7;
          arg2 = (void *)(**(code **)(*arg1 + 0x10))
                                   (arg1,&key,this_00,this_00->size_,DeleteCachedBlock);
          goto LAB_00543bba;
        }
      }
      else {
        this_00 = (Block *)(**(code **)(*arg1 + 0x28))(arg1,arg2);
        if (this_00 != (Block *)0x0) {
LAB_00543bba:
          this = Block::NewIterator(this_00,(Comparator *)**arg);
          if (arg2 == (void *)0x0) {
            Iterator::RegisterCleanup(this,DeleteBlock,this_00,(void *)0x0);
          }
          else {
            Iterator::RegisterCleanup(this,ReleaseBlock,arg1,arg2);
          }
          goto LAB_00543a24;
        }
      }
    }
  }
  this = NewErrorIterator(&s);
LAB_00543a24:
  Status::~Status(&s);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}